

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_shr_u64(c_v256 a,uint n)

{
  byte bVar1;
  uint in_ESI;
  c_v256 *in_RDI;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  undefined4 in_stack_00000020;
  
  if (0x3f < in_ESI) {
    fprintf(_stderr,"Error: undefined s64 shift right %d\n",(ulong)in_ESI);
    abort();
  }
  bVar1 = (byte)in_ESI;
  in_RDI->u64[3] = CONCAT44(n,in_stack_00000020) >> (bVar1 & 0x3f);
  in_RDI->u64[2] = in_stack_00000018 >> (bVar1 & 0x3f);
  in_RDI->u64[1] = in_stack_00000010 >> (bVar1 & 0x3f);
  in_RDI->u64[0] = in_stack_00000008 >> (bVar1 & 0x3f);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_u64(c_v256 a, unsigned int n) {
  c_v256 t;
  if (SIMD_CHECK && n > 63) {
    fprintf(stderr, "Error: undefined s64 shift right %d\n", n);
    abort();
  }
  t.u64[3] = a.u64[3] >> n;
  t.u64[2] = a.u64[2] >> n;
  t.u64[1] = a.u64[1] >> n;
  t.u64[0] = a.u64[0] >> n;
  return t;
}